

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void __thiscall ImGuiIO::AddInputCharactersUTF8(ImGuiIO *this,char *utf8_chars)

{
  long lVar1;
  int iVar2;
  long lVar3;
  int i;
  long lVar4;
  ImWchar wchars [17];
  ImWchar local_38 [20];
  
  lVar4 = 0;
  ImTextStrFromUtf8(local_38,0x11,utf8_chars,(char *)0x0,(char **)0x0);
  do {
    if (local_38[lVar4] == 0) {
      return;
    }
    if (this->InputCharacters[0] == 0) {
      lVar3 = 0;
    }
    else {
      lVar3 = 0;
      do {
        lVar1 = lVar3 + 1;
        lVar3 = lVar3 + 1;
      } while (this->InputCharacters[lVar1] != 0);
    }
    iVar2 = (int)lVar3;
    if (iVar2 < 0x10) {
      this->InputCharacters[iVar2] = local_38[lVar4];
      this->InputCharacters[(long)iVar2 + 1] = 0;
    }
    lVar4 = lVar4 + 1;
  } while (lVar4 != 0x11);
  return;
}

Assistant:

void ImGuiIO::AddInputCharactersUTF8(const char* utf8_chars)
{
    // We can't pass more wchars than ImGuiIO::InputCharacters[] can hold so don't convert more
    const int wchars_buf_len = sizeof(ImGuiIO::InputCharacters) / sizeof(ImWchar);
    ImWchar wchars[wchars_buf_len];
    ImTextStrFromUtf8(wchars, wchars_buf_len, utf8_chars, NULL);
    for (int i = 0; i < wchars_buf_len && wchars[i] != 0; i++)
        AddInputCharacter(wchars[i]);
}